

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

unique_lock<std::mutex> __thiscall pbrt::ThreadPool::AddToJobList(ThreadPool *this,ParallelJob *job)

{
  _func_int **pp_Var1;
  _func_int **in_RDX;
  undefined8 extraout_RDX;
  unique_lock<std::mutex> uVar2;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)this,(mutex_type *)&job->prev);
  pp_Var1 = job->_vptr_ParallelJob;
  if (pp_Var1 != (_func_int **)0x0) {
    pp_Var1[1] = (_func_int *)in_RDX;
  }
  in_RDX[2] = (_func_int *)pp_Var1;
  job->_vptr_ParallelJob = in_RDX;
  std::condition_variable::notify_all();
  uVar2._8_8_ = extraout_RDX;
  uVar2._M_device = (mutex_type *)this;
  return uVar2;
}

Assistant:

std::unique_lock<std::mutex> ThreadPool::AddToJobList(ParallelJob *job) {
    std::unique_lock<std::mutex> lock(jobListMutex);
    if (jobList != nullptr)
        jobList->prev = job;
    job->next = jobList;
    jobList = job;
    jobListCondition.notify_all();
    return lock;
}